

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::rowsInserted(QTreeView *this,QModelIndex *parent,int start,int end)

{
  QPersistentModelIndex *pQVar1;
  QTreeViewPrivate *this_00;
  QAbstractItemModel *pQVar2;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_01;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_02;
  char cVar3;
  int iVar4;
  int iVar5;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar6;
  pointer pQVar7;
  QWidget *this_03;
  int iVar8;
  long in_FS_OFFSET;
  bool bVar9;
  Bucket BVar10;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) ||
     (((parent->c != 0 && (-1 < (parent->c | parent->r))) &&
      ((parent->m).ptr != (QAbstractItemModel *)0x0)))) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QAbstractItemView::rowsInserted((QAbstractItemView *)this,parent,start,end);
      return;
    }
    goto LAB_005a6bed;
  }
  pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
  iVar4 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,parent);
  iVar8 = (end - start) + 1;
  pQVar1 = &(this_00->super_QAbstractItemViewPrivate).root;
  cVar3 = comparesEqual(pQVar1,parent);
  if (cVar3 == '\0') {
    pQVar2 = (parent->m).ptr;
    if (pQVar2 == (QAbstractItemModel *)0x0) {
LAB_005a6af0:
      local_58.m.ptr = (parent->m).ptr;
      local_58.r = parent->r;
      local_58.c = parent->c;
      local_58.i = parent->i;
      this_01 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                  **)(*(long *)((this_00->super_QAbstractItemViewPrivate).model + 8) + 0x90);
      if (this_01 !=
          (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
           *)0x0) {
        BVar10 = QHashPrivate::
                 Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                 ::findBucket<QtPrivate::QModelIndexWrapper>
                           (this_01,(QModelIndexWrapper *)&local_58);
        if ((BVar10.span[BVar10.index] != (Span)0xff) && (*(long *)(BVar10.span + 0x80) != 0)) {
          QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_58,parent);
          this_02 = (this_00->expandedIndexes).q_hash.d;
          if (this_02 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
            bVar9 = true;
          }
          else {
            pNVar6 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>
                     ::findNode<QPersistentModelIndex>(this_02,(QPersistentModelIndex *)&local_58);
            bVar9 = pNVar6 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
          }
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
          goto LAB_005a6bab;
        }
      }
      bVar9 = true;
    }
    else {
      cVar3 = (**(code **)(*(long *)pQVar2 + 0x138))(pQVar2,parent);
      bVar9 = true;
      if (-1 < cVar3) goto LAB_005a6af0;
    }
LAB_005a6bab:
    if ((!bVar9) || (iVar4 <= iVar8)) goto LAB_005a6a83;
  }
  else {
LAB_005a6a83:
    iVar5 = QTreeViewPrivate::viewIndex(this_00,parent);
    if ((iVar5 == -1) || (((this_00->viewItems).d.ptr[iVar5].field_0x1c & 1) == 0)) {
      cVar3 = comparesEqual(pQVar1,parent);
      if (cVar3 == '\0') {
        if ((iVar5 != -1) && (iVar4 == iVar8)) {
          pQVar7 = QList<QTreeViewItem>::data(&this_00->viewItems);
          pQVar7[iVar5].field_0x1c = pQVar7[iVar5].field_0x1c | 4;
          this_03 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
          QWidget::update(this_03);
        }
        goto LAB_005a6bbd;
      }
    }
    QAbstractItemViewPrivate::doDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate,0);
  }
LAB_005a6bbd:
  QAbstractItemView::rowsInserted((QAbstractItemView *)this,parent,start,end);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005a6bed:
  __stack_chk_fail();
}

Assistant:

void QTreeView::rowsInserted(const QModelIndex &parent, int start, int end)
{
    Q_D(QTreeView);
    // if we are going to do a complete relayout anyway, there is no need to update
    if (d->delayedPendingLayout) {
        QAbstractItemView::rowsInserted(parent, start, end);
        return;
    }

    //don't add a hierarchy on a column != 0
    if (parent.column() != 0 && parent.isValid()) {
        QAbstractItemView::rowsInserted(parent, start, end);
        return;
    }

    const int parentRowCount = d->model->rowCount(parent);
    const int delta = end - start + 1;
    if (parent != d->root && !d->isIndexExpanded(parent) && parentRowCount > delta) {
        QAbstractItemView::rowsInserted(parent, start, end);
        return;
    }

    const int parentItem = d->viewIndex(parent);
    if (((parentItem != -1) && d->viewItems.at(parentItem).expanded)
        || (parent == d->root)) {
        d->doDelayedItemsLayout();
    } else if (parentItem != -1 && parentRowCount == delta) {
        // the parent just went from 0 children to more. update to re-paint the decoration
        d->viewItems[parentItem].hasChildren = true;
        viewport()->update();
    }
    QAbstractItemView::rowsInserted(parent, start, end);
}